

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

assetsys_error_t
assetsys_file_load(assetsys_t *sys,assetsys_file_t f,int *size,void *buffer,int capacity)

{
  int iVar1;
  mz_bool mVar2;
  assetsys_internal_mount_t *paVar3;
  assetsys_internal_file_t *paVar4;
  char *pcVar5;
  FILE *__stream;
  long lVar6;
  size_t sVar7;
  int size_read;
  int file_size;
  FILE *fp;
  mz_bool result;
  assetsys_internal_file_t *file;
  assetsys_internal_mount_t *mount;
  int mount_index;
  int capacity_local;
  void *buffer_local;
  int *size_local;
  assetsys_t *sys_local;
  
  iVar1 = assetsys_internal_find_mount_index(sys,f.mount,f.path);
  if (iVar1 < 0) {
    sys_local._4_4_ = ASSETSYS_ERROR_INVALID_MOUNT;
  }
  else {
    paVar3 = sys->mounts + iVar1;
    paVar4 = paVar3->files + f.index;
    if (paVar3->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP) {
      if (size != (int *)0x0) {
        *size = paVar4->size;
      }
      if (capacity < paVar4->size) {
        sys_local._4_4_ = ASSETSYS_ERROR_BUFFER_TOO_SMALL;
      }
      else {
        mVar2 = mz_zip_reader_extract_to_mem_no_alloc
                          (&paVar3->zip,paVar4->zip_index,buffer,(long)paVar4->size,0,(void *)0x0,0)
        ;
        sys_local._4_4_ = ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        if (mVar2 != 0) {
          sys_local._4_4_ = ASSETSYS_SUCCESS;
        }
      }
    }
    else {
      if (size != (int *)0x0) {
        *size = paVar4->size;
      }
      pcVar5 = assetsys_internal_get_string(sys,paVar3->path);
      strcpy(sys->temp,pcVar5);
      pcVar5 = "/";
      if (sys->temp[0] == '\0') {
        pcVar5 = "";
      }
      strcat(sys->temp,pcVar5);
      pcVar5 = assetsys_internal_get_string(sys,sys->collated[paVar4->collated_index].path);
      strcat(sys->temp,pcVar5 + (long)paVar3->mount_len + 1);
      __stream = fopen(sys->temp,"rb");
      if (__stream == (FILE *)0x0) {
        sys_local._4_4_ = ASSETSYS_ERROR_FAILED_TO_READ_FILE;
      }
      else {
        fseek(__stream,0,2);
        lVar6 = ftell(__stream);
        iVar1 = (int)lVar6;
        fseek(__stream,0,0);
        if (size != (int *)0x0) {
          *size = iVar1;
        }
        if (capacity < iVar1) {
          fclose(__stream);
          sys_local._4_4_ = ASSETSYS_ERROR_BUFFER_TOO_SMALL;
        }
        else {
          sVar7 = fread(buffer,1,(long)iVar1,__stream);
          fclose(__stream);
          if ((int)sVar7 == iVar1) {
            sys_local._4_4_ = ASSETSYS_SUCCESS;
          }
          else {
            sys_local._4_4_ = ASSETSYS_ERROR_FAILED_TO_READ_FILE;
          }
        }
      }
    }
  }
  return sys_local._4_4_;
}

Assistant:

assetsys_error_t assetsys_file_load( assetsys_t* sys, assetsys_file_t f, int* size, void* buffer, int capacity )
    {
    int mount_index = assetsys_internal_find_mount_index( sys, f.mount, f.path );
    if( mount_index < 0 ) return ASSETSYS_ERROR_INVALID_MOUNT;

    struct assetsys_internal_mount_t* mount = &sys->mounts[ mount_index ];
    struct assetsys_internal_file_t* file = &mount->files[ f.index ];
    if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        if( size ) *size = (int) file->size;
        if( file->size > capacity ) return ASSETSYS_ERROR_BUFFER_TOO_SMALL;

        mz_bool result = mz_zip_reader_extract_to_mem_no_alloc( &mount->zip, (mz_uint) file->zip_index, buffer, 
            (size_t) file->size, 0, 0, 0 ); 
        return result ? ASSETSYS_SUCCESS : ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        }
    else
        {
        if( size ) *size = file->size;
        strcpy( sys->temp, assetsys_internal_get_string( sys, mount->path ) );
        strcat( sys->temp, *sys->temp == '\0' ? "" : "/" );
        strcat( sys->temp, assetsys_internal_get_string( sys, 
            sys->collated[ file->collated_index ].path ) + mount->mount_len + 1 );
        FILE* fp = fopen( sys->temp, "rb" );
        if( !fp ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;
        
        fseek( fp, 0, SEEK_END );
        int file_size = (int) ftell( fp );
        fseek( fp, 0, SEEK_SET );
        if( size ) *size = file_size;

        if( file_size > capacity ) { fclose( fp ); return ASSETSYS_ERROR_BUFFER_TOO_SMALL; }

        int size_read = (int) fread( buffer, 1, (size_t) file_size, fp );
        fclose( fp );
        if( size_read != file_size ) return ASSETSYS_ERROR_FAILED_TO_READ_FILE;

        return ASSETSYS_SUCCESS;
        }
    }